

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xss.cpp
# Opt level: O3

void __thiscall
cppcms::xss::rules_holder<cppcms::xss::compare_c_string,_true>::add_property
          (rules_holder<cppcms::xss::compare_c_string,_true> *this,string *tname,string *pname,
          validator_type *r)

{
  tags_type *this_00;
  iterator iVar1;
  mapped_type *pmVar2;
  mapped_type *this_01;
  c_string cname;
  c_string local_c0;
  c_string local_90;
  c_string local_60;
  
  details::c_string::c_string(&local_60,tname);
  this_00 = &this->tags;
  iVar1 = std::
          _Rb_tree<cppcms::xss::details::c_string,_std::pair<const_cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::compare_c_string,_true>::tag>,_std::_Select1st<std::pair<const_cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::compare_c_string,_true>::tag>_>,_cppcms::xss::compare_c_string,_std::allocator<std::pair<const_cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::compare_c_string,_true>::tag>_>_>
          ::find(&this_00->_M_t,&local_60);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->tags)._M_t._M_impl.super__Rb_tree_header) {
    pmVar2 = std::
             map<cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::compare_c_string,_true>::tag,_cppcms::xss::compare_c_string,_std::allocator<std::pair<const_cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::compare_c_string,_true>::tag>_>_>
             ::operator[](this_00,&local_60);
    pmVar2->type = invalid_tag;
  }
  details::c_string::c_string(&local_90,tname);
  pmVar2 = std::
           map<cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::compare_c_string,_true>::tag,_cppcms::xss::compare_c_string,_std::allocator<std::pair<const_cppcms::xss::details::c_string,_cppcms::xss::rules_holder<cppcms::xss::compare_c_string,_true>::tag>_>_>
           ::operator[](this_00,&local_90);
  details::c_string::c_string(&local_c0,pname);
  this_01 = std::
            map<cppcms::xss::details::c_string,_std::function<bool_(const_char_*,_const_char_*)>,_cppcms::xss::compare_c_string,_std::allocator<std::pair<const_cppcms::xss::details::c_string,_std::function<bool_(const_char_*,_const_char_*)>_>_>_>
            ::operator[](&pmVar2->properties,&local_c0);
  std::function<bool_(const_char_*,_const_char_*)>::operator=(this_01,r);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.container_._M_dataplus._M_p != &local_c0.container_.field_2) {
    operator_delete(local_c0.container_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.container_._M_dataplus._M_p != &local_90.container_.field_2) {
    operator_delete(local_90.container_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.container_._M_dataplus._M_p != &local_60.container_.field_2) {
    operator_delete(local_60.container_._M_dataplus._M_p);
  }
  return;
}

Assistant:

void add_property(std::string const &tname,std::string const &pname,validator_type const &r)
		{
			c_string cname(tname);
			if(tags.find(cname)==tags.end())
				tags[cname].type=rules::invalid_tag;
			
			tags[c_string(tname)].properties[c_string(pname)]=r;
		}